

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

bool __thiscall
Am_Inter_Location_Data::operator==(Am_Inter_Location_Data *this,Am_Inter_Location_Data *test_data)

{
  bool bVar1;
  bool local_19;
  Am_Inter_Location_Data *test_data_local;
  Am_Inter_Location_Data *this_local;
  
  bVar1 = Am_Object::operator==(&this->ref_obj,&test_data->ref_obj);
  local_19 = false;
  if ((((bVar1) && (local_19 = false, (this->as_line & 1U) == (test_data->as_line & 1U))) &&
      (local_19 = false, (this->growing & 1U) == (test_data->growing & 1U))) &&
     (((local_19 = false, (this->data).rect.left == (test_data->data).rect.left &&
       (local_19 = false, (this->data).rect.top == (test_data->data).rect.top)) &&
      (local_19 = false, (this->data).rect.width == (test_data->data).rect.width)))) {
    local_19 = (this->data).rect.height == (test_data->data).rect.height;
  }
  return local_19;
}

Assistant:

bool operator==(const Am_Inter_Location_Data &test_data) const
  {
    return ((ref_obj == test_data.ref_obj) && (as_line == test_data.as_line) &&
            (growing == test_data.growing) &&
            (data.line.x1 == test_data.data.line.x1) &&
            (data.line.y1 == test_data.data.line.y1) &&
            (data.line.x2 == test_data.data.line.x2) &&
            (data.line.y2 == test_data.data.line.y2));
  }